

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O0

deBool deSocket_close(deSocket *sock)

{
  int iVar1;
  deSocket *sock_local;
  
  deMutex_lock(sock->stateLock);
  if (sock->state == DE_SOCKETSTATE_CLOSED) {
    deMutex_unlock(sock->stateLock);
    sock_local._4_4_ = 0;
  }
  else {
    if (sock->state == DE_SOCKETSTATE_LISTENING) {
      shutdown(sock->handle,2);
    }
    iVar1 = close(sock->handle);
    if (iVar1 == 0) {
      sock->state = DE_SOCKETSTATE_CLOSED;
      sock->handle = -1;
      sock->openChannels = 0;
      deMutex_unlock(sock->stateLock);
      sock_local._4_4_ = 1;
    }
    else {
      sock_local._4_4_ = 0;
    }
  }
  return sock_local._4_4_;
}

Assistant:

deBool deSocket_close (deSocket* sock)
{
	deMutex_lock(sock->stateLock);

	if (sock->state == DE_SOCKETSTATE_CLOSED)
	{
		deMutex_unlock(sock->stateLock);
		return DE_FALSE;
	}

#if !defined(DE_USE_WINSOCK)
	if (sock->state == DE_SOCKETSTATE_LISTENING)
	{
		/* There can be a thread blockin in accept(). Release it by calling shutdown. */
		shutdown(sock->handle, SHUT_RDWR);
	}
#endif

#if defined(DE_USE_WINSOCK)
	if (closesocket(sock->handle) != 0)
		return DE_FALSE;
#else
	if (close(sock->handle) != 0)
		return DE_FALSE;
#endif
	sock->state			= DE_SOCKETSTATE_CLOSED;
	sock->handle		= DE_INVALID_SOCKET_HANDLE;
	sock->openChannels	= 0;

	deMutex_unlock(sock->stateLock);
	return DE_TRUE;
}